

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O3

effect_object_property * effect_summarize_properties(effect *ef,int *unsummarized_count)

{
  _Bool _Var1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  effect_object_property *peVar5;
  ulong uVar6;
  long lVar7;
  timed_failure *ptVar8;
  effect_object_property *peVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  dice_t *pdVar12;
  wchar_t wVar13;
  dice_t *pdVar14;
  effect_object_property_kind eVar15;
  bool bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  int unsummarized;
  int local_64;
  effect_object_property *local_60;
  dice_t *local_58;
  int *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_64 = 0;
  local_60 = (effect_object_property *)0x0;
  local_50 = unsummarized_count;
  if (ef != (effect *)0x0) {
    pdVar12 = (dice_t *)0x0;
    do {
      uVar2 = ef->index;
      uVar3 = (uint)uVar2;
      if (0x3a < uVar2) {
        if (uVar2 < 0x7a) {
          if (2 < uVar3 - 0x3b) goto switchD_00144a05_caseD_2;
          peVar5 = (effect_object_property *)mem_alloc(0x18);
          peVar5->next = local_60;
          peVar5->idx = L'\x1d';
          peVar5->reslevel_min = L'\0';
          peVar5->reslevel_max = L'\0';
          peVar5->kind = EFPROP_CONFLICT_FLAG;
          local_60 = peVar5;
        }
        else if (uVar3 != 0x7a) {
          if (uVar3 == 0x7c) goto LAB_00144bb5;
          if (uVar3 != 0x7b) goto switchD_00144a05_caseD_2;
          pdVar12 = ef->dice;
        }
        goto switchD_00144a05_caseD_1;
      }
      switch(uVar3) {
      case 1:
        break;
      default:
switchD_00144a05_caseD_2:
        local_64 = local_64 + 1;
        break;
      case 8:
        wVar13 = ef->subtype;
        if ((uint)wVar13 < 0x35) {
LAB_00144ad2:
          summarize_cure(wVar13,&local_60,&local_64);
        }
        break;
      case 9:
        pdVar14 = pdVar12;
        if ((((pdVar12 == (dice_t *)0x0) && (pdVar14 = ef->dice, pdVar14 == (dice_t *)0x0)) ||
            (iVar4 = dice_evaluate(pdVar14,0,MAXIMISE,(random_value *)0x0), iVar4 < 1)) &&
           (wVar13 = ef->subtype, (uint)wVar13 < 0x35)) goto LAB_00144ad2;
      case 10:
      case 0xb:
        pdVar14 = pdVar12;
        if ((pdVar12 == (dice_t *)0x0) && (pdVar14 = ef->dice, pdVar14 == (dice_t *)0x0)) {
LAB_00144bb5:
          pdVar12 = (dice_t *)0x0;
        }
        else {
          iVar4 = dice_evaluate(pdVar14,0,MAXIMISE,(random_value *)0x0);
          if (0 < iVar4) {
            wVar13 = ef->subtype;
            uVar6 = (ulong)(uint)wVar13;
            if (uVar6 < 0x35) {
              wVar10 = timed_effects[uVar6].oflag_dup;
              bVar16 = wVar10 != L'\0';
              local_58 = pdVar12;
              if (bVar16) {
                _Var1 = timed_effects[uVar6].oflag_syn;
                peVar5 = (effect_object_property *)mem_alloc(0x18);
                peVar5->next = local_60;
                peVar5->idx = wVar10;
                peVar5->reslevel_min = L'\0';
                peVar5->reslevel_max = L'\0';
                peVar5->kind = _Var1 ^ EFPROP_OBJECT_FLAG;
                wVar13 = ef->subtype;
                local_60 = peVar5;
              }
              lVar7 = (long)wVar13;
              wVar13 = timed_effects[lVar7].temp_resist;
              peVar5 = local_60;
              if (L'\xffffffff' < wVar13) {
                ptVar8 = timed_effects[lVar7].fail;
                if (ptVar8 == (timed_failure *)0x0) {
                  wVar10 = L'È';
                  wVar11 = L'\n';
                }
                else {
                  wVar11 = L'\n';
                  wVar10 = L'È';
                  do {
                    if (ptVar8->idx == wVar13) {
                      if (ptVar8->code == 3) {
                        wVar10 = L'd';
                      }
                      else if (ptVar8->code == 2) {
                        wVar11 = L'Q';
                      }
                    }
                    ptVar8 = ptVar8->next;
                  } while (ptVar8 != (timed_failure *)0x0);
                }
                peVar5 = (effect_object_property *)mem_alloc(0x18);
                peVar5->next = local_60;
                peVar5->idx = wVar13;
                peVar5->reslevel_min = wVar11;
                peVar5->reslevel_max = wVar10;
                peVar5->kind = EFPROP_RESIST;
                lVar7 = (long)ef->subtype;
                bVar16 = true;
              }
              ptVar8 = timed_effects[lVar7].fail;
              if (ptVar8 != (timed_failure *)0x0) {
                do {
                  iVar4 = ptVar8->code;
                  if (iVar4 == 3) {
                    wVar13 = ptVar8->idx;
                    wVar10 = ef->subtype;
                    eVar15 = EFPROP_CONFLICT_VULN;
                    uVar17 = 0;
                    uVar18 = 100;
LAB_00144c77:
                    if (wVar13 != timed_effects[wVar10].temp_resist) {
LAB_00144c84:
                      local_48 = CONCAT44(uVar18,uVar17);
                      uStack_40 = 0;
                      peVar9 = (effect_object_property *)mem_alloc(0x18);
                      peVar9->next = peVar5;
                      peVar9->idx = wVar13;
                      peVar9->reslevel_min = (wchar_t)local_48;
                      peVar9->reslevel_max = local_48._4_4_;
                      peVar9->kind = eVar15;
                      bVar16 = true;
                      peVar5 = peVar9;
                    }
                  }
                  else {
                    if (iVar4 == 2) {
                      wVar13 = ptVar8->idx;
                      wVar10 = ef->subtype;
                      eVar15 = EFPROP_CONFLICT_RESIST;
                      uVar17 = 0x51;
                      uVar18 = 200;
                      goto LAB_00144c77;
                    }
                    if (iVar4 == 1) {
                      wVar13 = ptVar8->idx;
                      uVar17 = 0;
                      uVar18 = 0;
                      eVar15 = EFPROP_CONFLICT_FLAG;
                      goto LAB_00144c84;
                    }
                  }
                  ptVar8 = ptVar8->next;
                } while (ptVar8 != (timed_failure *)0x0);
                lVar7 = (long)ef->subtype;
              }
              wVar13 = timed_effects[lVar7].temp_brand;
              local_60 = peVar5;
              if (wVar13 < L'\0') {
                wVar13 = timed_effects[lVar7].temp_slay;
                if (L'\xffffffff' < wVar13) goto LAB_00144d17;
                pdVar12 = local_58;
                if (!bVar16) {
                  local_64 = local_64 + 1;
                }
              }
              else {
                local_60 = (effect_object_property *)mem_alloc(0x18);
                local_60->next = peVar5;
                local_60->idx = wVar13;
                local_60->reslevel_min = L'\0';
                local_60->reslevel_max = L'\0';
                local_60->kind = EFPROP_BRAND;
                wVar13 = timed_effects[ef->subtype].temp_slay;
                pdVar12 = local_58;
                peVar5 = local_60;
                if (L'\xffffffff' < wVar13) {
LAB_00144d17:
                  local_60 = peVar5;
                  local_60 = (effect_object_property *)mem_alloc(0x18);
                  local_60->next = peVar5;
                  local_60->idx = wVar13;
                  local_60->reslevel_min = L'\0';
                  local_60->reslevel_max = L'\0';
                  local_60->kind = EFPROP_SLAY;
                  pdVar12 = local_58;
                }
              }
            }
          }
        }
        break;
      case 0xd:
        pdVar14 = pdVar12;
        if ((pdVar12 != (dice_t *)0x0) || (pdVar14 = ef->dice, pdVar14 != (dice_t *)0x0)) {
          iVar4 = dice_evaluate(pdVar14,0,MAXIMISE,(random_value *)0x0);
          if (0 < iVar4) {
            wVar13 = ef->subtype;
            goto LAB_00144ad2;
          }
          break;
        }
        goto LAB_00144bb5;
      }
switchD_00144a05_caseD_1:
      ef = ef->next;
    } while (ef != (effect *)0x0);
  }
  if (local_50 != (int *)0x0) {
    *local_50 = local_64;
  }
  return local_60;
}

Assistant:

struct effect_object_property *effect_summarize_properties(
		const struct effect *ef, int *unsummarized_count)
{
	int unsummarized = 0;
	struct effect_object_property *summaries = NULL;
	dice_t *remembered_dice = NULL;

	for (; ef; ef = ef->next) {
		int value_this;

		switch (ef->index) {
		case EF_RANDOM:
		case EF_SELECT:
			/*
			 * For random or select effects, summarize all of the
			 * subeffects since any of them is possible.  That's
			 * equivalent to simply skipping over the random or
			 * select effect and stepping one by one through what
			 * follows.
			 */
			break;

		case EF_SET_VALUE:
			/*
			 * Remember the value.  Does nothing that should be
			 * remembered in the summaries or unsummarized count.
			 */
			remembered_dice = ef->dice;
			break;

		case EF_CLEAR_VALUE:
			/*
			 * Forget the value.  Does nothing that should be
			 * remembered in the summaries or unsummarized count.
			 */
			remembered_dice = NULL;
			break;

		case EF_CURE:
			if (ef->subtype >= 0 && ef->subtype < TMD_MAX) {
				summarize_cure(ef->subtype, &summaries,
					&unsummarized);
			}
			break;

		case EF_TIMED_SET:
			value_this = (remembered_dice) ?
				dice_evaluate(remembered_dice, 0, MAXIMISE, NULL) :
				((ef->dice) ?
				dice_evaluate(ef->dice, 0, MAXIMISE, NULL) : 0);
			if (value_this <= 0 && ef->subtype >= 0 &&
					ef->subtype < TMD_MAX) {
				/* It's equivalent to a cure. */
				summarize_cure(ef->subtype, &summaries,
					&unsummarized);
				break;
			}
			/* Fall through. */

		case EF_TIMED_INC:
		case EF_TIMED_INC_NO_RES:
			value_this = (remembered_dice) ?
				dice_evaluate(remembered_dice, 0, MAXIMISE, NULL) :
				((ef->dice) ?
				dice_evaluate(ef->dice, 0, MAXIMISE, NULL) : 0);
			if (value_this > 0 && ef->subtype >= 0 &&
					ef->subtype < TMD_MAX) {
				bool summarized = false;
				const struct timed_failure *f;

				if (timed_effects[ef->subtype].oflag_dup !=
						OF_NONE) {
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].oflag_dup,
						0, 0,
						timed_effects[ef->subtype].oflag_syn ?
						EFPROP_OBJECT_FLAG_EXACT : EFPROP_OBJECT_FLAG);
					summarized = true;
				}
				if (timed_effects[ef->subtype].temp_resist >= 0) {
					/*
					 * At RES_LEVEL_BASE, the benefit from
					 * RES_BOOST_NORMAL is a drop of 40
					 * in the resistance level.  When the
					 * benefit drops to less than a 1/10th
					 * of that say that there's limited
					 * benefit.  That happens when the
					 * resistance level is less than 10.
					 */
					int rmin = 10, rmax = RES_LEVEL_MIN;

					f = timed_effects[ef->subtype].fail;
					while (f) {
						if (f->idx == timed_effects[ef->subtype].temp_resist) {
							if (f->code == TMD_FAIL_FLAG_RESIST) {
								rmin = MAX(rmin, RES_LEVEL_EFFECT + 1);
							} else if (f->code == TMD_FAIL_FLAG_VULN) {
								rmax = MIN(rmax, RES_LEVEL_BASE);
							}
						}
						f = f->next;
					}
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].temp_resist,
						rmin, rmax, EFPROP_RESIST);
					summarized = true;
				}
				f = timed_effects[ef->subtype].fail;
				while (f) {
					switch (f->code) {
					case TMD_FAIL_FLAG_OBJECT:
						add_to_summaries(&summaries,
							f->idx, 0, 0,
							EFPROP_CONFLICT_FLAG);
						summarized = true;
						break;

					case TMD_FAIL_FLAG_RESIST:
						if (f->idx != timed_effects[ef->subtype].temp_resist) {
							add_to_summaries(
								&summaries,
								f->idx,
								RES_LEVEL_EFFECT + 1,
								RES_LEVEL_MIN,
								EFPROP_CONFLICT_RESIST);
							summarized = true;
						}
						break;

					case TMD_FAIL_FLAG_VULN:
						if (f->idx != timed_effects[ef->subtype].temp_resist) {
							add_to_summaries(
								&summaries,
								f->idx,
								RES_LEVEL_MAX,
								RES_LEVEL_BASE,
								EFPROP_CONFLICT_VULN);
							summarized = true;
						}
						break;

					default:
						/* Nothing special is needed. */
						break;
					}
					f = f->next;
				}
				if (timed_effects[ef->subtype].temp_brand >= 0) {
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].temp_brand,
						0, 0, EFPROP_BRAND);
					summarized = true;
				}
				if (timed_effects[ef->subtype].temp_slay >= 0) {
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].temp_slay,
						0, 0, EFPROP_SLAY);
					summarized = true;
				}
				if (!summarized) ++unsummarized;
			}
			break;

		case EF_TIMED_DEC:
			value_this = (remembered_dice) ?
				dice_evaluate(remembered_dice, 0, MAXIMISE, NULL) :
				((ef->dice) ?
				dice_evaluate(ef->dice, 0, MAXIMISE, NULL) : 0);
			/* If it decreases the duration, it's a partial cure. */
			if (value_this > 0) {
				summarize_cure(ef->subtype, &summaries,
					&unsummarized);
			}
			break;

		case EF_TELEPORT:
		case EF_TELEPORT_TO:
		case EF_TELEPORT_LEVEL:
			add_to_summaries(&summaries, OF_NO_TELEPORT,
				0, 0, EFPROP_CONFLICT_FLAG);
			break;

		/*
		 * There's other effects that have limited utility when the
		 * object already has some flags:
		 * DISABLE_TRAPS with OF_TRAP_IMMUNE is only good for unlocking
		 * DETECT_INVISIBLE with OF_SEE_INVISIBLE or OF_TELEPATHY
		 * RESTORE_x with OF_SUST_x
		 * RESTORE_EXP with OF_HOLD_LIFE
		 * For now, don't try to flag those.
		 */
		default:
			/*
			 * Everything else isn't related to an object property.
			 */
			++unsummarized;
			break;
		}
	}

	if (unsummarized_count) *unsummarized_count = unsummarized;
	return summaries;
}